

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<true>::tryme<2u,4u,4u,5u>(uint32_t *n,size_t len)

{
  uint *puVar1;
  uint32_t i;
  uint32_t i_1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 2;
  if (len < 2) {
    uVar2 = len;
  }
  uVar3 = 0;
  while (uVar2 != uVar3) {
    puVar1 = n + uVar3;
    uVar3 = uVar3 + 1;
    if (0xf < *puVar1) {
      return false;
    }
  }
  uVar3 = 4;
  if (len - uVar2 < 4) {
    uVar3 = len - uVar2;
  }
  uVar3 = uVar3 + uVar2;
  do {
    bVar4 = uVar3 <= uVar2;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = n + uVar2;
    uVar2 = uVar2 + 1;
  } while (*puVar1 < 0x20);
  return bVar4;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }